

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_enlarge(BUFFER_HANDLE handle,size_t enlargeSize)

{
  LOGGER_LOG p_Var1;
  uchar *puVar2;
  size_t local_58;
  LOGGER_LOG l_2;
  size_t malloc_size;
  BUFFER *b;
  uchar *temp;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  size_t enlargeSize_local;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_enlarge",0x15f,1,"Failure: handle is invalid.");
    }
    l._4_4_ = 0x160;
  }
  else if (enlargeSize == 0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/buffer.c"
                ,"BUFFER_enlarge",0x165,1,"Failure: enlargeSize size is 0.");
    }
    l._4_4_ = 0x166;
  }
  else {
    if (handle->size < -enlargeSize - 1) {
      local_58 = handle->size + enlargeSize;
    }
    else {
      local_58 = 0xffffffffffffffff;
    }
    if ((local_58 == 0xffffffffffffffff) ||
       (puVar2 = (uchar *)realloc(handle->buffer,local_58), puVar2 == (uchar *)0x0)) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/buffer.c"
                  ,"BUFFER_enlarge",0x171,1,"Failure: allocating temp buffer, size:%zu",local_58);
      }
      l._4_4_ = 0x172;
    }
    else {
      handle->buffer = puVar2;
      handle->size = enlargeSize + handle->size;
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int BUFFER_enlarge(BUFFER_HANDLE handle, size_t enlargeSize)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_017: [BUFFER_enlarge shall return a nonzero result if any parameters are NULL or zero.] */
        LogError("Failure: handle is invalid.");
        result = MU_FAILURE;
    }
    else if (enlargeSize == 0)
    {
        /* Codes_SRS_BUFFER_07_017: [BUFFER_enlarge shall return a nonzero result if any parameters are NULL or zero.] */
        LogError("Failure: enlargeSize size is 0.");
        result = MU_FAILURE;
    }
    else
    {
        unsigned char* temp;
        BUFFER* b = (BUFFER*)handle;
        size_t malloc_size = safe_add_size_t(b->size, enlargeSize);
        if (malloc_size == SIZE_MAX ||
            (temp = (unsigned char*)realloc(b->buffer, malloc_size)) == NULL)
        {
            /* Codes_SRS_BUFFER_07_018: [BUFFER_enlarge shall return a nonzero result if any error is encountered.] */
            LogError("Failure: allocating temp buffer, size:%zu", malloc_size);
            result = MU_FAILURE;
        }
        else
        {
            b->buffer = temp;
            b->size += enlargeSize;
            result = 0;
        }
    }
    return result;
}